

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O0

void * TCMalloc_SystemAlloc(size_t size,size_t *actual_size,size_t alignment)

{
  LogItem b;
  LogItem c;
  LogItem d;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogItem a;
  LogItem local_90;
  LogItem local_80;
  LogItem local_70;
  LogItem local_60;
  size_t local_50;
  void *result;
  size_t actual_size_storage;
  SpinLockHolder local_30;
  SpinLockHolder lock_holder;
  size_t alignment_local;
  size_t *actual_size_local;
  size_t size_local;
  
  if (size + alignment < size) {
    size_local = 0;
  }
  else {
    lock_holder.lock_ = (SpinLock *)alignment;
    SpinLockHolder::SpinLockHolder(&local_30,&spinlock);
    if ((system_alloc_inited & 1U) == 0) {
      InitSystemAllocators();
      system_alloc_inited = true;
    }
    if (lock_holder.lock_ < (SpinLock *)0x40) {
      lock_holder.lock_ = (SpinLock *)0x40;
    }
    alignment_local = (size_t)actual_size;
    if (actual_size == (size_t *)0x0) {
      alignment_local = (size_t)&result;
    }
    iVar2 = (*tcmalloc_sys_alloc->_vptr_SysAllocator[2])
                      (tcmalloc_sys_alloc,size,alignment_local,lock_holder.lock_);
    local_50 = CONCAT44(extraout_var,iVar2);
    if (local_50 != 0) {
      bVar1 = CheckAddressBits((local_50 - 1) + *(long *)alignment_local);
      if (!bVar1) {
        tcmalloc::LogItem::LogItem
                  (&local_60,
                   "CheckAddressBits(reinterpret_cast<uintptr_t>(result) + *actual_size - 1)");
        tcmalloc::LogItem::LogItem(&local_70);
        tcmalloc::LogItem::LogItem(&local_80);
        tcmalloc::LogItem::LogItem(&local_90);
        a._4_4_ = 0;
        a.tag_ = local_60.tag_;
        b.u_.str = local_70.u_.str;
        b.tag_ = local_70.tag_;
        b._4_4_ = local_70._4_4_;
        c.u_.str = local_80.u_.str;
        c.tag_ = local_80.tag_;
        c._4_4_ = local_80._4_4_;
        d.u_.str = local_90.u_.str;
        d.tag_ = local_90.tag_;
        d._4_4_ = local_90._4_4_;
        a.u_.str = local_60.u_.str;
        tcmalloc::Log(kCrash,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/system-alloc.cc"
                      ,0x197,a,b,c,d);
        do {
        } while( true );
      }
      TCMalloc_SystemTaken = *(long *)alignment_local + TCMalloc_SystemTaken;
    }
    size_local = local_50;
    SpinLockHolder::~SpinLockHolder(&local_30);
  }
  return (void *)size_local;
}

Assistant:

void* TCMalloc_SystemAlloc(size_t size, size_t *actual_size,
                           size_t alignment) {
  // Discard requests that overflow
  if (size + alignment < size) return nullptr;

  SpinLockHolder lock_holder(&spinlock);

  if (!system_alloc_inited) {
    InitSystemAllocators();
    system_alloc_inited = true;
  }

  // Enforce minimum alignment
  if (alignment < sizeof(MemoryAligner)) alignment = sizeof(MemoryAligner);

  size_t actual_size_storage;
  if (actual_size == nullptr) {
    actual_size = &actual_size_storage;
  }

  void* result = tcmalloc_sys_alloc->Alloc(size, actual_size, alignment);
  if (result != nullptr) {
    CHECK_CONDITION(
      CheckAddressBits(reinterpret_cast<uintptr_t>(result) + *actual_size - 1));
    TCMalloc_SystemTaken += *actual_size;
  }
  return result;
}